

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

int zt_cstr_cmp(char *s1,ssize_t i1,ssize_t j1,char *s2,ssize_t i2,ssize_t j2)

{
  size_t sVar1;
  ssize_t sVar2;
  char *__s1;
  char *__s2;
  size_t sVar3;
  char *in_RCX;
  char *in_RDI;
  int cond_1;
  int cond;
  ssize_t t_1;
  size_t len_1;
  ssize_t t;
  size_t len;
  size_t in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int local_74;
  long local_38;
  long local_30;
  long local_20;
  long local_18;
  int local_4;
  
  sVar1 = strlen(in_RDI);
  if (sVar1 == 0) {
    local_18 = 0;
    local_20 = 0;
  }
  else {
    local_18 = IDX(CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff68);
    sVar2 = IDX(CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                in_stack_ffffffffffffff68);
    local_20 = sVar2;
    if (sVar2 < local_18) {
      local_20 = local_18;
      local_18 = sVar2;
    }
  }
  sVar1 = strlen(in_RCX);
  if (sVar1 == 0) {
    local_30 = 0;
    local_38 = 0;
  }
  else {
    local_30 = IDX(CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff68);
    sVar2 = IDX(CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                in_stack_ffffffffffffff68);
    local_38 = sVar2;
    if (sVar2 < local_30) {
      local_38 = local_30;
      local_30 = sVar2;
    }
  }
  __s1 = in_RDI + local_18;
  __s2 = in_RCX + local_30;
  if (local_20 - local_18 < local_38 - local_30) {
    sVar3 = IDXLEN(local_18,local_20);
    local_74 = strncmp(__s1,__s2,sVar3);
    if (local_74 == 0) {
      local_74 = -1;
    }
    local_4 = local_74;
  }
  else if (local_38 - local_30 < local_20 - local_18) {
    sVar3 = IDXLEN(local_30,local_38);
    local_4 = strncmp(__s1,__s2,sVar3);
    if (local_4 == 0) {
      local_4 = 1;
    }
  }
  else {
    local_4 = strncmp(__s1,__s2,local_20 - local_18);
  }
  return local_4;
}

Assistant:

int
zt_cstr_cmp(const char *s1, ssize_t i1, ssize_t j1,
            const char *s2, ssize_t i2, ssize_t j2) {
    CONVERT(s1, i1, j1);
    CONVERT(s2, i2, j2);

    s1 += i1;
    s2 += i2;

    if (j1 - i1 < j2 - i2) {
        int cond = strncmp(s1, s2, IDXLEN(i1, j1));
        return cond == 0 ? -1 : cond;
    } else if (j1 - i1 > j2 - i2) {
        int cond = strncmp(s1, s2, IDXLEN(i2, j2));
        return cond == 0 ? +1 : cond;
    }

    return strncmp(s1, s2, j1 - i1);
}